

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_ellswift_xdh
              (secp256k1_context *ctx,uchar *output,uchar *ell_a64,uchar *ell_b64,uchar *seckey32,
              int party,secp256k1_ellswift_xdh_hash_function hashfp,void *data)

{
  undefined4 extraout_EAX;
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  uchar *a;
  undefined1 auVar4 [16];
  int overflow;
  uchar *local_148;
  secp256k1_fe xd;
  uchar sx [32];
  secp256k1_scalar s;
  secp256k1_fe px;
  secp256k1_fe t;
  secp256k1_fe u;
  secp256k1_fe xn;
  
  if (output == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "output != NULL";
  }
  else if (ell_a64 == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "ell_a64 != NULL";
  }
  else if (ell_b64 == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "ell_b64 != NULL";
  }
  else if (seckey32 == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "seckey32 != NULL";
  }
  else {
    if (hashfp != (secp256k1_ellswift_xdh_hash_function)0x0) {
      a = ell_a64;
      if (party == 0) {
        a = ell_b64;
      }
      local_148 = output;
      secp256k1_fe_impl_set_b32_mod(&u,a);
      secp256k1_fe_impl_set_b32_mod(&t,a + 0x20);
      secp256k1_ellswift_xswiftec_frac_var(&xn,&xd,&u,&t);
      secp256k1_scalar_set_b32(&s,seckey32,&overflow);
      auVar4._0_4_ = -(uint)((int)s.d[0] == 0 && (int)s.d[2] == 0);
      auVar4._4_4_ = -(uint)(s.d[0]._4_4_ == 0 && s.d[2]._4_4_ == 0);
      auVar4._8_4_ = -(uint)((int)s.d[1] == 0 && (int)s.d[3] == 0);
      auVar4._12_4_ = -(uint)(s.d[1]._4_4_ == 0 && s.d[3]._4_4_ == 0);
      iVar1 = movmskps(extraout_EAX,auVar4);
      overflow = (int)(iVar1 == 0xf);
      secp256k1_scalar_cmov(&s,&secp256k1_scalar_one,overflow);
      secp256k1_ecmult_const_xonly(&px,&xn,&xd,&s,1);
      secp256k1_fe_impl_normalize(&px);
      secp256k1_fe_impl_get_b32(sx,&px);
      iVar1 = (*hashfp)(local_148,sx,ell_a64,ell_b64,data);
      return (uint)(overflow == 0 && iVar1 != 0);
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "hashfp != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_ellswift_xdh(const secp256k1_context *ctx, unsigned char *output, const unsigned char *ell_a64, const unsigned char *ell_b64, const unsigned char *seckey32, int party, secp256k1_ellswift_xdh_hash_function hashfp, void *data) {
    int ret = 0;
    int overflow;
    secp256k1_scalar s;
    secp256k1_fe xn, xd, px, u, t;
    unsigned char sx[32];
    const unsigned char* theirs64;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(ell_a64 != NULL);
    ARG_CHECK(ell_b64 != NULL);
    ARG_CHECK(seckey32 != NULL);
    ARG_CHECK(hashfp != NULL);

    /* Load remote public key (as fraction). */
    theirs64 = party ? ell_a64 : ell_b64;
    secp256k1_fe_set_b32_mod(&u, theirs64);
    secp256k1_fe_set_b32_mod(&t, theirs64 + 32);
    secp256k1_ellswift_xswiftec_frac_var(&xn, &xd, &u, &t);

    /* Load private key (using one if invalid). */
    secp256k1_scalar_set_b32(&s, seckey32, &overflow);
    overflow = secp256k1_scalar_is_zero(&s);
    secp256k1_scalar_cmov(&s, &secp256k1_scalar_one, overflow);

    /* Compute shared X coordinate. */
    secp256k1_ecmult_const_xonly(&px, &xn, &xd, &s, 1);
    secp256k1_fe_normalize(&px);
    secp256k1_fe_get_b32(sx, &px);

    /* Invoke hasher */
    ret = hashfp(output, sx, ell_a64, ell_b64, data);

    secp256k1_memclear(sx, sizeof(sx));
    secp256k1_fe_clear(&px);
    secp256k1_scalar_clear(&s);

    return !!ret & !overflow;
}